

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float __thiscall
ImGui::RoundScalarWithFormatT<float,float>(ImGui *this,char *format,ImGuiDataType data_type,float v)

{
  ImGui IVar1;
  char cVar2;
  double dVar3;
  char cVar4;
  undefined4 in_register_00000014;
  long lVar5;
  char *__nptr;
  char *pcVar6;
  float fVar7;
  char fmt_sanitized [32];
  char v_str [64];
  char local_78 [32];
  char local_58 [64];
  
  IVar1 = *this;
  while( true ) {
    if (IVar1 == (ImGui)0x0) {
      return v;
    }
    if ((IVar1 == (ImGui)0x25) && (this[1] != (ImGui)0x25)) break;
    this = this + (ulong)(IVar1 == (ImGui)0x25) + 1;
    IVar1 = *this;
  }
  SanitizeFormatString((char *)this,local_78,CONCAT44(in_register_00000014,data_type));
  ImFormatString(local_58,0x40,local_78,SUB84((double)v,0));
  pcVar6 = local_58;
  do {
    __nptr = pcVar6;
    cVar2 = *__nptr;
    pcVar6 = __nptr + 1;
  } while (cVar2 == ' ');
  if (((uint)format & 0xfffffffe) == 8) {
    dVar3 = atof(__nptr);
    fVar7 = (float)dVar3;
  }
  else {
    lVar5 = (ulong)(__nptr[cVar2 == '-'] == '+') + (ulong)(cVar2 == '-');
    cVar4 = __nptr[lVar5];
    fVar7 = 0.0;
    if ((byte)(cVar4 - 0x30U) < 10) {
      pcVar6 = __nptr + 1 + lVar5;
      do {
        fVar7 = fVar7 * 10.0 + (float)(int)(char)(cVar4 + -0x30);
        cVar4 = *pcVar6;
        pcVar6 = pcVar6 + 1;
      } while ((byte)(cVar4 - 0x30U) < 10);
    }
    if (cVar2 == '-') {
      fVar7 = -fVar7;
    }
  }
  return fVar7;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}